

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

error_code llvm::sys::fs::copy_file(Twine *From,int ToFD)

{
  bool bVar1;
  error_code eVar2;
  int local_28;
  int local_24;
  int ReadFD;
  int ToFD_local;
  Twine *From_local;
  error_code EC;
  
  local_24 = ToFD;
  _ReadFD = From;
  eVar2 = openFileForRead(From,&local_28,F_None,(SmallVectorImpl<char> *)0x0);
  EC._0_8_ = eVar2._M_cat;
  From_local._0_4_ = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&From_local);
  if (!bVar1) {
    eVar2 = copy_file_internal(local_28,local_24);
    EC._0_8_ = eVar2._M_cat;
    From_local._0_4_ = eVar2._M_value;
    close(local_28);
  }
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)From_local;
  eVar2._M_cat = (error_category *)EC._0_8_;
  return eVar2;
}

Assistant:

std::error_code copy_file(const Twine &From, int ToFD) {
  int ReadFD;
  if (std::error_code EC = openFileForRead(From, ReadFD, OF_None))
    return EC;

  std::error_code EC = copy_file_internal(ReadFD, ToFD);

  close(ReadFD);

  return EC;
}